

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::IOEffect::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IOEffect *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  StandardVariable::GetAsString_abi_cxx11_(&local_1c0,&this->super_StandardVariable);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Status:            ");
  ENUMS::GetEnumAsStringIOStatus_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(byte)(this->super_StandardVariable).field_0xe,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Link Type:         ");
  ENUMS::GetEnumAsStringIOLinkType_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)(byte)(this->super_StandardVariable).field_0xf,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Effect:            ");
  ENUMS::GetEnumAsStringIOEffectType_abi_cxx11_(&local_220,(ENUMS *)(ulong)this->m_ui8Eff,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Effect Duty Cycle: ");
  poVar1 = std::operator<<(poVar1,this->m_ui8EffDtyCyc);
  poVar1 = std::operator<<(poVar1,"%\n");
  poVar1 = std::operator<<(poVar1,"Effect Duration:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16EffDur);
  poVar1 = std::operator<<(poVar1," seconds\n");
  poVar1 = std::operator<<(poVar1,"Process:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Proc);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IOEffect::GetAsString() const
{
    KStringStream ss;

    ss << StandardVariable::GetAsString()
       << "Status:            " << GetEnumAsStringIOStatus( m_ui8Status )    << "\n"
       << "Link Type:         " << GetEnumAsStringIOLinkType( m_ui8LnkTyp )  << "\n"
       << "Effect:            " << GetEnumAsStringIOEffectType( m_ui8Eff )   << "\n"
       << "Effect Duty Cycle: " << m_ui8EffDtyCyc                            << "%\n"
       << "Effect Duration:   " << m_ui16EffDur                              << " seconds\n"
       << "Process:           " << m_ui16Proc                                << "\n";

    return ss.str();
}